

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_padding.cpp
# Opt level: O0

void test_2d_dynamic<0ul,0ul,1ul,1ul>(void)

{
  int *piVar1;
  int *piVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  ulong uVar7;
  long lVar8;
  size_type sVar9;
  reference pvVar10;
  bool bVar11;
  int local_204 [3];
  dynamic_dims_array local_1f8;
  int local_1e8 [2];
  dynamic_dims_array local_1e0;
  size_type local_1d0;
  dynamic_dims_array local_1c8;
  unsigned_long local_1b8;
  value_type true_idx_1;
  int local_19c;
  undefined1 auStack_198 [4];
  int i_1;
  int local_184;
  int local_180;
  int j_1;
  dynamic_dims_array local_178;
  int local_168 [2];
  dynamic_dims_array local_160;
  size_type local_150;
  dynamic_dims_array local_148;
  unsigned_long local_138;
  value_type true_idx;
  int local_11c;
  undefined1 auStack_118 [4];
  int i;
  int local_104;
  int *piStack_100;
  int j;
  int *dptr;
  allocator<int> local_e5;
  value_type_conflict1 local_e4;
  dynamic_dims_array local_e0;
  dynamic_dims_array local_d0;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> data;
  size_type local_a0;
  unsigned_long local_98;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  int local_74;
  size_type local_70;
  bool local_66;
  bool local_65;
  bool local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_60;
  dimensions<1UL,_1UL> local_49;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_48;
  undefined1 local_38 [8];
  layout_mapping_left<dimensions<dyn,_dyn>,_dimensions<1,_1>,_dimensions<dyn,_dyn>_> l;
  
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_48,1,1);
  std::experimental::dimensions<1UL,_1UL>::dimensions(&local_49);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_60,0,0);
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
  ::layout_mapping_regular_precomputed_strides
            ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              *)local_38,local_48.dynamic_dims_._M_elems[0],local_48.dynamic_dims_._M_elems[1],
             local_60.dynamic_dims_._M_elems[0],local_60.dynamic_dims_._M_elems[1]);
  local_61 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_regular();
  local_62 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7a,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_61,&local_62
            );
  local_63 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_dynamic_stride(0);
  local_64 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7c,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_63,&local_64
            );
  local_65 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_dynamic_stride(1);
  local_66 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7d,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_65,&local_66
            );
  local_70 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                       *)local_38,0);
  local_74 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7f,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_70,&local_74
            );
  local_80 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                       *)local_38,1);
  local_88 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","N + X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x80,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_80,&local_88
            );
  local_90 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38);
  local_98 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x82,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_90,&local_98
            );
  local_a0 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::span((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)local_38);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x83,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_a0,
             (unsigned_long *)
             &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,0);
  local_d0._M_elems =
       (_Type)std::experimental::detail::
              layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                      *)local_38);
  vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&local_d0,0)
  ;
  vVar5 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,1);
  local_e0._M_elems =
       (_Type)std::experimental::detail::
              layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                      *)local_38);
  vVar6 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&local_e0,1)
  ;
  local_e4 = 0x2a;
  std::allocator<int>::allocator(&local_e5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c0,(vVar3 + vVar4) * (vVar5 + vVar6),
             &local_e4,&local_e5);
  std::allocator<int>::~allocator(&local_e5);
  piStack_100 = std::vector<int,_std::allocator<int>_>::data
                          ((vector<int,_std::allocator<int>_> *)local_c0);
  local_104 = 0;
  while( true ) {
    uVar7 = (ulong)local_104;
    vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,1
                           );
    _auStack_118 = (_Type)std::experimental::detail::
                          layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                          ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                  *)local_38);
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                            auStack_118,1);
    if (vVar3 + vVar4 <= uVar7) break;
    local_11c = 0;
    while( true ) {
      uVar7 = (ulong)local_11c;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      _true_idx = (_Type)std::experimental::detail::
                         layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                         ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                 *)local_38);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,0);
      if (vVar3 + vVar4 <= uVar7) break;
      lVar8 = (long)local_11c;
      local_148._M_elems =
           (_Type)std::experimental::detail::
                  layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                  ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                          *)local_38);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_148,0);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      local_138 = lVar8 + (vVar3 + vVar4) * (long)local_104;
      local_150 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_11c,local_104);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0x91,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_150,
                 &local_138);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      bVar11 = false;
      if (vVar3 <= (ulong)(long)local_11c) {
        uVar7 = (ulong)local_11c;
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,0);
        local_160._M_elems =
             (_Type)std::experimental::detail::
                    layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                    ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                            *)local_38);
        vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_160,0);
        bVar11 = uVar7 < vVar3 + vVar4;
      }
      piVar1 = piStack_100;
      if (bVar11) {
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_38,local_11c,local_104);
        piVar2 = piStack_100;
        piVar1[sVar9] = 0x11;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_38,local_11c,local_104);
        local_168[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                   ,0x98,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                   piVar2 + sVar9,local_168 + 1);
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_38,local_11c,local_104);
        pvVar10 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)local_c0,sVar9);
        local_168[0] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                   ,0x9b,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",pvVar10,
                   local_168);
      }
      else {
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,1);
        bVar11 = false;
        if (vVar3 <= (ulong)(long)local_104) {
          uVar7 = (ulong)local_104;
          vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  local_38,1);
          local_178._M_elems =
               (_Type)std::experimental::detail::
                      layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                      ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                              *)local_38);
          vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  &local_178,1);
          bVar11 = uVar7 < vVar3 + vVar4;
        }
        piVar1 = piStack_100;
        if (bVar11) {
          sVar9 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_11c,local_104);
          piVar2 = piStack_100;
          piVar1[sVar9] = 0x18;
          sVar9 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_11c,local_104);
          j_1 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                     ,0xa3,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                     piVar2 + sVar9,&j_1);
          sVar9 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_11c,local_104);
          pvVar10 = std::vector<int,_std::allocator<int>_>::at
                              ((vector<int,_std::allocator<int>_> *)local_c0,sVar9);
          local_180 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                     ,0xa6,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",pvVar10,
                     &local_180);
        }
      }
      local_11c = local_11c + 1;
    }
    local_104 = local_104 + 1;
  }
  local_184 = 0;
  while( true ) {
    uVar7 = (ulong)local_184;
    vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,1
                           );
    _auStack_198 = (_Type)std::experimental::detail::
                          layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                          ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                  *)local_38);
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                            auStack_198,1);
    if (vVar3 + vVar4 <= uVar7) break;
    local_19c = 0;
    while( true ) {
      uVar7 = (ulong)local_19c;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      _true_idx_1 = (_Type)std::experimental::detail::
                           layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                           ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                   *)local_38);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx_1,0);
      if (vVar3 + vVar4 <= uVar7) break;
      lVar8 = (long)local_19c;
      local_1c8._M_elems =
           (_Type)std::experimental::detail::
                  layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                  ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                          *)local_38);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_1c8,0);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      local_1b8 = lVar8 + (vVar3 + vVar4) * (long)local_184;
      local_1d0 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_19c,local_184);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xb0,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_1d0,
                 &local_1b8);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      bVar11 = false;
      if (vVar3 <= (ulong)(long)local_19c) {
        uVar7 = (ulong)local_19c;
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,0);
        local_1e0._M_elems =
             (_Type)std::experimental::detail::
                    layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                    ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                            *)local_38);
        vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_1e0,0);
        bVar11 = uVar7 < vVar3 + vVar4;
      }
      piVar1 = piStack_100;
      if (bVar11) {
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_38,local_19c,local_184);
        local_1e8[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                   ,0xb5,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                   piVar1 + sVar9,local_1e8 + 1);
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_38,local_19c,local_184);
        pvVar10 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)local_c0,sVar9);
        local_1e8[0] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                   ,0xb8,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",pvVar10,
                   local_1e8);
      }
      else {
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,1);
        bVar11 = false;
        if (vVar3 <= (ulong)(long)local_184) {
          uVar7 = (ulong)local_184;
          vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  local_38,1);
          local_1f8._M_elems =
               (_Type)std::experimental::detail::
                      layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                      ::pads((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                              *)local_38);
          vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  &local_1f8,1);
          bVar11 = uVar7 < vVar3 + vVar4;
        }
        piVar1 = piStack_100;
        if (bVar11) {
          sVar9 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_19c,local_184);
          local_204[2] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                     ,0xbe,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                     piVar1 + sVar9,local_204 + 2);
          sVar9 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_19c,local_184);
          pvVar10 = std::vector<int,_std::allocator<int>_>::at
                              ((vector<int,_std::allocator<int>_> *)local_c0,sVar9);
          local_204[1] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                     ,0xc1,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",pvVar10,
                     local_204 + 1);
        }
        else {
          sVar9 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_38,local_19c,local_184);
          local_204[0] = 0x2a;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","42",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                     ,199,"void test_2d_dynamic() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                     piVar1 + sVar9,local_204);
        }
      }
      local_19c = local_19c + 1;
    }
    local_184 = local_184 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<dyn, dyn>
    > const l{{X, Y}, {}, {N, M}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), N + X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    // Initialize all elements to 42.
    vector<int> data(
        (l[0] + l.pads()[0]) * (l[1] + l.pads()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}